

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>::doEvaluate
          (IVal *__return_storage_ptr__,Variable<tcu::Vector<float,_3>_> *this,EvalContext *ctx)

{
  bool *pbVar1;
  undefined7 uVar2;
  IVal *pIVar3;
  long lVar4;
  IVal *pIVar5;
  byte bVar6;
  
  bVar6 = 0;
  pIVar3 = Environment::lookup<tcu::Vector<float,3>>(ctx->env,this);
  lVar4 = 8;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar4 + -8) = 0;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar4;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x50);
  pIVar5 = __return_storage_ptr__;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    uVar2 = *(undefined7 *)&pIVar3->m_data[0].field_0x1;
    pIVar5->m_data[0].m_hasNaN = pIVar3->m_data[0].m_hasNaN;
    *(undefined7 *)&pIVar5->m_data[0].field_0x1 = uVar2;
    pIVar3 = (IVal *)((long)pIVar3 + ((ulong)bVar6 * -2 + 1) * 8);
    pIVar5 = (IVal *)((long)pIVar5 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

IVal			doEvaluate	(const EvalContext& ctx)		const
	{
		return ctx.env.lookup<T>(*this);
	}